

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O2

void xemmai::t_code::f_rethrow(void)

{
  string_view a_string;
  undefined8 uVar1;
  long *plVar2;
  t_slot *this;
  char *__s;
  t_object *ptVar3;
  size_t unaff_RBX;
  char *unaff_R14;
  undefined1 auVar4 [12];
  wstring_view in_stack_ffffffffffffffb8;
  
  std::current_exception();
  auVar4 = std::rethrow_exception(&stack0xffffffffffffffb8);
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)&stack0xffffffffffffffb8);
  if (auVar4._8_4_ == 3) {
    __cxa_begin_catch(auVar4._0_8_);
    uVar1 = __cxa_rethrow();
    __cxa_end_catch();
    _Unwind_Resume(uVar1);
  }
  plVar2 = (long *)__cxa_begin_catch(auVar4._0_8_);
  this = (t_slot *)__cxa_allocate_exception(0x10);
  if (auVar4._8_4_ == 2) {
    __s = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    strlen(__s);
    a_string._M_str = unaff_R14;
    a_string._M_len = unaff_RBX;
    portable::f_convert_abi_cxx11_(a_string);
    ptVar3 = t_throwable::f_instantiate(in_stack_ffffffffffffffb8);
    t_slot::t_slot(this,ptVar3);
    __cxa_throw(this,&t_value<xemmai::t_root>::typeinfo,t_root::~t_root);
  }
  ptVar3 = t_throwable::f_instantiate(in_stack_ffffffffffffffb8);
  t_slot::t_slot(this,ptVar3);
  __cxa_throw(this,&t_value<xemmai::t_root>::typeinfo,t_root::~t_root);
}

Assistant:

void t_code::f_rethrow()
{
	try {
		std::rethrow_exception(std::current_exception());
	} catch (const t_rvalue&) {
		throw;
	} catch (std::exception& e) {
		throw t_rvalue(t_throwable::f_instantiate(portable::f_convert(e.what())));
	} catch (...) {
		throw t_rvalue(t_throwable::f_instantiate(L"<unknown>."sv));
	}
}